

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_stdio.c
# Opt level: O0

ALLEGRO_FILE * al_make_temp_file(char *template,ALLEGRO_PATH **ret_path)

{
  ALLEGRO_PATH *path_00;
  ALLEGRO_PATH *path_01;
  ALLEGRO_FILE *func;
  char *in_RSI;
  char *in_RDI;
  ALLEGRO_FILE *f;
  ALLEGRO_PATH *path;
  char *temp_filename;
  char *in_stack_ffffffffffffffd8;
  undefined8 in_stack_ffffffffffffffe0;
  int line;
  size_t in_stack_ffffffffffffffe8;
  
  line = (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20);
  strlen(in_RDI);
  path_00 = (ALLEGRO_PATH *)
            al_malloc_with_context
                      (in_stack_ffffffffffffffe8,line,in_stack_ffffffffffffffd8,(char *)0x176fd7);
  path_01 = al_get_standard_path((int)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
  if ((path_00 == (ALLEGRO_PATH *)0x0) || (path_01 == (ALLEGRO_PATH *)0x0)) {
    func = (ALLEGRO_FILE *)0x0;
  }
  else {
    func = make_temp_file(in_RDI,in_RSI,path_00);
  }
  al_free_with_context(in_RSI,(int)((ulong)path_00 >> 0x20),(char *)path_01,(char *)func);
  if ((func == (ALLEGRO_FILE *)0x0) || (in_RSI == (char *)0x0)) {
    al_destroy_path(path_01);
  }
  else {
    *(ALLEGRO_PATH **)in_RSI = path_01;
  }
  return func;
}

Assistant:

ALLEGRO_FILE *al_make_temp_file(const char *template, ALLEGRO_PATH **ret_path)
{
   char *temp_filename;
   ALLEGRO_PATH *path;
   ALLEGRO_FILE *f;

   temp_filename = al_malloc(strlen(template) + 1);
   path = al_get_standard_path(ALLEGRO_TEMP_PATH);

   if (temp_filename && path)
      f = make_temp_file(template, temp_filename, path);
   else
      f = NULL;

   al_free(temp_filename);

   if (f && ret_path)
      *ret_path = path;
   else
      al_destroy_path(path);

   return f;
}